

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O1

LispPTR reclaimstackp(LispPTR ptr)

{
  ushort uVar1;
  
  if ((ptr & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)ptr);
  }
  uVar1 = Lisp_world[ptr];
  if ((uVar1 & 1) != 0) {
    printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)(uint)uVar1);
  }
  decusecount68k((FX *)((ulong)((uint)uVar1 * 2) + (long)Stackspace));
  return 0;
}

Assistant:

LispPTR reclaimstackp(LispPTR ptr) /* This is the entry function */
                                   /*  in stack reclaiming */
{
  STACKP *stkp;
  FX *fxp;
  stkp = (STACKP *)NativeAligned4FromLAddr(ptr);
  fxp = (FX *)NativeAligned4FromStackOffset(stkp->edfxp);
  decusecount68k(fxp); /* decrement the use-count for the frame it uses */
  return (NIL);        /* and let the normal reclaimer reclaim it */
}